

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddGroup.c
# Opt level: O2

int zddReorderChildren(DdManager *table,MtrNode *treenode,Cudd_ReorderingType method)

{
  uint lower;
  MtrHalfWord MVar1;
  MtrHalfWord MVar2;
  DdNode *pDVar3;
  DdSubtable *pDVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  void *pvVar9;
  long lVar10;
  uint uVar11;
  MtrNode *pMVar12;
  long lVar13;
  uint upper;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  int *piVar17;
  ulong uVar18;
  DdNode *pDVar19;
  void *__ptr;
  bool bVar20;
  DdNode *local_70;
  void *local_68;
  uint local_5c;
  void *local_58;
  int *local_50;
  uint local_48;
  int local_44;
  long local_40;
  long local_38;
  
  uVar14 = table->sizeZ;
  if ((int)uVar14 <= (int)treenode->low) {
    return 1;
  }
  piVar17 = table->permZ;
  lower = piVar17[treenode->index];
  upper = (lower + treenode->size) - 1;
  if ((int)uVar14 <= (int)upper) {
    pMVar12 = treenode->child;
    if (pMVar12 == (MtrNode *)0x0) {
      upper = uVar14 - 1;
    }
    else {
      upper = 0xffffffff;
      for (; pMVar12 != (MtrNode *)0x0; pMVar12 = pMVar12->younger) {
        uVar11 = piVar17[pMVar12->low] - 1;
        if ((int)(pMVar12->size + uVar11) < (int)uVar14) {
          uVar11 = upper;
        }
        if (piVar17[pMVar12->low] < (int)uVar14) {
          upper = uVar11;
        }
      }
    }
  }
  if (upper == 0xffffffff) {
    return 1;
  }
  iVar6 = 1;
  iVar7 = iVar6;
  if (treenode->flags != 4) {
    iVar7 = 0;
    switch(method) {
    case CUDD_REORDER_RANDOM:
    case CUDD_REORDER_RANDOM_PIVOT:
      iVar7 = cuddZddSwapping(table,lower,upper,method);
      break;
    case CUDD_REORDER_SIFT:
      iVar7 = cuddZddSifting(table,lower,upper);
      break;
    case CUDD_REORDER_SIFT_CONVERGE:
      uVar14 = table->keysZ;
      do {
        iVar7 = cuddZddSifting(table,lower,upper);
        if (uVar14 <= table->keysZ) break;
        uVar14 = table->keysZ;
      } while (iVar7 != 0);
      break;
    case CUDD_REORDER_SYMM_SIFT:
      iVar7 = cuddZddSymmSifting(table,lower,upper);
      break;
    case CUDD_REORDER_SYMM_SIFT_CONV:
      iVar7 = cuddZddSymmSiftingConv(table,lower,upper);
      break;
    default:
      goto switchD_006752bf_caseD_8;
    case CUDD_REORDER_GROUP_SIFT:
      entry = (int *)0x0;
      local_68 = (void *)((long)(int)uVar14 * 4);
      pvVar9 = malloc((size_t)local_68);
      if (pvVar9 == (void *)0x0) {
        table->errorCode = CUDD_MEMORY_OUT;
        __ptr = (void *)0x0;
      }
      else {
        local_58 = pvVar9;
        entry = (int *)malloc((size_t)local_68);
        if (entry != (int *)0x0) {
          local_50 = entry;
          local_68 = malloc((size_t)local_68);
          if (local_68 == (void *)0x0) {
            table->errorCode = CUDD_MEMORY_OUT;
            piVar17 = local_50;
            goto LAB_006757ec;
          }
          uVar16 = 0;
          uVar18 = (ulong)uVar14;
          if ((int)uVar14 < 1) {
            uVar18 = uVar16;
          }
          local_44 = 0;
          for (; uVar18 != uVar16; uVar16 = uVar16 + 1) {
            *(undefined4 *)((long)local_68 + uVar16 * 4) = 0;
            uVar14 = piVar17[uVar16];
            if (table->subtableZ[(int)uVar14].next <= uVar14) {
              local_50[uVar16] = table->subtableZ[(int)uVar14].keys;
              *(int *)((long)local_58 + (long)local_44 * 4) = (int)uVar16;
              local_44 = local_44 + 1;
            }
          }
          qsort(local_58,(long)local_44,4,zddUniqueCompareGroup);
          piVar17 = (int *)0x0;
          pvVar9 = local_68;
          iVar7 = local_44;
          while( true ) {
            iVar8 = table->siftMaxVar;
            if (iVar7 < table->siftMaxVar) {
              iVar8 = iVar7;
            }
            if (((long)iVar8 <= (long)piVar17) || (table->siftMaxSwap <= zddTotalNumberSwapping))
            break;
            lVar10 = (long)*(int *)((long)local_58 + (long)piVar17 * 4);
            if (((*(int *)((long)pvVar9 + lVar10 * 4) != 1) &&
                (uVar14 = table->permZ[lVar10], (int)lower <= (int)uVar14)) &&
               ((int)uVar14 <= (int)upper)) {
              uVar11 = table->keysZ;
              local_70 = (DdNode *)0x0;
              if (uVar14 == lower) {
                uVar14 = lower;
                if (lower != upper) {
                  local_50 = piVar17;
                  local_38 = lVar10;
                  iVar7 = zddGroupSiftingDown(table,lower,upper,(Move **)&local_70);
                  pDVar19 = local_70;
                  if (iVar7 != 0) goto LAB_006756c5;
                  goto LAB_0067577f;
                }
              }
              else {
                local_40 = (long)(int)uVar14;
                local_5c = uVar11;
                local_50 = piVar17;
                local_48 = uVar14;
                local_38 = lVar10;
                iVar7 = cuddZddNextHigh(table,uVar14);
                if ((int)upper < iVar7) {
                  uVar11 = table->subtableZ[local_40].next;
LAB_00675637:
                  iVar7 = zddGroupSiftingUp(table,uVar11,lower,(Move **)&local_70);
                }
                else {
                  if ((int)(upper - uVar14) < (int)(uVar14 - lower)) {
                    iVar7 = zddGroupSiftingDown(table,local_48,upper,(Move **)&local_70);
                    pDVar19 = local_70;
                    if (iVar7 != 0) {
                      uVar14 = local_48;
                      if (local_70 != (DdNode *)0x0) {
                        uVar14 = local_70->ref;
                      }
                      do {
                        uVar11 = table->subtableZ[(int)uVar14].next;
                        bVar20 = uVar14 < uVar11;
                        uVar14 = uVar11;
                      } while (bVar20);
                      goto LAB_00675637;
                    }
                    goto LAB_0067577f;
                  }
                  uVar14 = table->subtableZ[local_40].next;
                  iVar7 = zddGroupSiftingUp(table,uVar14,lower,(Move **)&local_70);
                  pDVar19 = local_70;
                  if (iVar7 == 0) goto LAB_0067577f;
                  if (local_70 != (DdNode *)0x0) {
                    uVar14 = local_70->index;
                  }
                  do {
                    uVar11 = uVar14;
                    uVar14 = table->subtableZ[(int)uVar11].next;
                  } while (uVar11 < uVar14);
                  iVar7 = zddGroupSiftingDown(table,uVar11,upper,(Move **)&local_70);
                }
                pDVar19 = local_70;
                uVar11 = local_5c;
                if (iVar7 == 0) goto LAB_0067577f;
LAB_006756c5:
                pDVar19 = local_70;
                iVar7 = zddGroupSiftingBackward(table,(Move *)local_70,uVar11);
                if (iVar7 == 0) goto LAB_0067577f;
                while (pDVar19 != (DdNode *)0x0) {
                  pDVar3 = (pDVar19->type).kids.T;
                  pDVar19->ref = 0;
                  pDVar19->next = table->nextFree;
                  table->nextFree = pDVar19;
                  pDVar19 = pDVar3;
                }
                uVar14 = table->permZ[local_38];
                pvVar9 = local_68;
                piVar17 = local_50;
                iVar7 = local_44;
              }
              pDVar4 = table->subtableZ;
              if (uVar14 != pDVar4[(int)uVar14].next) {
                piVar5 = table->invpermZ;
                uVar11 = uVar14;
                do {
                  *(undefined4 *)((long)pvVar9 + (long)piVar5[(int)uVar11] * 4) = 1;
                  uVar11 = pDVar4[(int)uVar11].next;
                } while (uVar11 != uVar14);
              }
            }
            piVar17 = (int *)((long)piVar17 + 1);
          }
          free(pvVar9);
          free(local_58);
          iVar7 = iVar6;
          if (entry != (int *)0x0) {
            free(entry);
            entry = (int *)0x0;
          }
          break;
        }
        table->errorCode = CUDD_MEMORY_OUT;
        pvVar9 = local_58;
        __ptr = (void *)0x0;
      }
LAB_00675807:
      free(pvVar9);
      free(__ptr);
      iVar7 = 0;
      break;
    case CUDD_REORDER_LINEAR:
      iVar7 = cuddZddLinearSifting(table,lower,upper);
      break;
    case CUDD_REORDER_LINEAR_CONVERGE:
      uVar14 = table->keysZ;
      do {
        iVar7 = cuddZddLinearSifting(table,lower,upper);
        if (uVar14 <= table->keysZ) break;
        uVar14 = table->keysZ;
      } while (iVar7 != 0);
    }
  }
  lVar10 = (long)(int)lower;
  if (table->treeZ != treenode) {
    lVar13 = lVar10 * 0x38 + 0x1c;
    uVar14 = lower;
    for (lVar15 = lVar10; uVar14 = uVar14 + 1, lVar15 < (int)upper; lVar15 = lVar15 + 1) {
      *(uint *)((long)&table->subtableZ->nodelist + lVar13) = uVar14;
      lVar13 = lVar13 + 0x38;
    }
    table->subtableZ[(int)upper].next = lower;
  }
  MVar1 = treenode->index;
  MVar2 = table->invpermZ[lVar10];
  do {
    treenode->index = MVar2;
    treenode = treenode->parent;
    if (treenode == (MtrNode *)0x0) {
      return iVar7;
    }
  } while (treenode->index == MVar1);
switchD_006752bf_caseD_8:
  return iVar7;
LAB_0067577f:
  while (pDVar19 != (DdNode *)0x0) {
    pDVar3 = (pDVar19->type).kids.T;
    pDVar19->ref = 0;
    pDVar19->next = table->nextFree;
    table->nextFree = pDVar19;
    pDVar19 = pDVar3;
  }
  pvVar9 = local_58;
  piVar17 = entry;
  __ptr = local_68;
  if (entry != (int *)0x0) {
LAB_006757ec:
    free(piVar17);
    entry = (int *)0x0;
    pvVar9 = local_58;
    __ptr = local_68;
  }
  goto LAB_00675807;
}

Assistant:

static int
zddReorderChildren(
  DdManager * table,
  MtrNode * treenode,
  Cudd_ReorderingType method)
{
    int lower;
    int upper = -1;
    int result;
    unsigned int initialSize;

    zddFindNodeHiLo(table,treenode,&lower,&upper);
    /* If upper == -1 these variables do not exist yet. */
    if (upper == -1)
        return(1);

    if (treenode->flags == MTR_FIXED) {
        result = 1;
    } else {
#ifdef DD_STATS
        (void) fprintf(table->out," ");
#endif
        switch (method) {
        case CUDD_REORDER_RANDOM:
        case CUDD_REORDER_RANDOM_PIVOT:
            result = cuddZddSwapping(table,lower,upper,method);
            break;
        case CUDD_REORDER_SIFT:
            result = cuddZddSifting(table,lower,upper);
            break;
        case CUDD_REORDER_SIFT_CONVERGE:
            do {
                initialSize = table->keysZ;
                result = cuddZddSifting(table,lower,upper);
                if (initialSize <= table->keysZ)
                    break;
#ifdef DD_STATS
                else
                    (void) fprintf(table->out,"\n");
#endif
            } while (result != 0);
            break;
        case CUDD_REORDER_SYMM_SIFT:
            result = cuddZddSymmSifting(table,lower,upper);
            break;
        case CUDD_REORDER_SYMM_SIFT_CONV:
            result = cuddZddSymmSiftingConv(table,lower,upper);
            break;
        case CUDD_REORDER_GROUP_SIFT:
            result = zddGroupSifting(table,lower,upper);
            break;
        case CUDD_REORDER_LINEAR:
            result = cuddZddLinearSifting(table,lower,upper);
            break;
        case CUDD_REORDER_LINEAR_CONVERGE:
            do {
                initialSize = table->keysZ;
                result = cuddZddLinearSifting(table,lower,upper);
                if (initialSize <= table->keysZ)
                    break;
#ifdef DD_STATS
                else
                    (void) fprintf(table->out,"\n");
#endif
            } while (result != 0);
            break;
        default:
            return(0);
        }
    }

    /* Create a single group for all the variables that were sifted,
    ** so that they will be treated as a single block by successive
    ** invocations of zddGroupSifting.
    */
    zddMergeGroups(table,treenode,lower,upper);

#ifdef DD_DEBUG
    if (pr > 0) (void) fprintf(table->out,"zddReorderChildren:");
#endif

    return(result);

}